

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O1

void plutovg_path_traverse_dashed
               (plutovg_path_t *path,float offset,float *dashes,int ndashes,
               plutovg_path_traverse_func_t traverse_func,void *closure)

{
  ulong uVar1;
  float fVar2;
  float *local_70;
  int local_68;
  float local_64;
  float local_60;
  int local_5c;
  int local_58;
  byte local_54;
  byte local_53;
  undefined8 local_50;
  plutovg_path_traverse_func_t local_48;
  void *local_40;
  float local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  if (ndashes < 1) {
    local_38 = 0.0;
  }
  else {
    local_38 = 0.0;
    uVar1 = 0;
    do {
      local_38 = local_38 + dashes[uVar1];
      uVar1 = uVar1 + 1;
    } while ((uint)ndashes != uVar1);
  }
  if ((ndashes & 0x80000001U) == 1) {
    local_38 = local_38 + local_38;
  }
  if (local_38 <= 0.0) {
    plutovg_path_traverse(path,traverse_func,closure);
    return;
  }
  uStack_34 = 0;
  uStack_30 = 0;
  uStack_2c = 0;
  local_70 = dashes;
  local_68 = ndashes;
  fVar2 = fmodf(offset,local_38);
  local_64 = (float)(~-(uint)(fVar2 < 0.0) & (uint)fVar2 |
                    (uint)(local_38 + fVar2) & -(uint)(fVar2 < 0.0));
  if (local_64 <= 0.0) {
    local_5c = 0;
    local_54 = 1;
  }
  else {
    local_54 = 1;
    local_5c = 0;
    do {
      uVar1 = (long)local_5c % (long)local_68 & 0xffffffff;
      if (local_64 < local_70[uVar1]) break;
      local_64 = local_64 - dashes[uVar1];
      local_54 = local_54 ^ 1;
      local_5c = local_5c + 1;
    } while (0.0 < local_64);
  }
  local_50 = 0;
  local_60 = local_64;
  local_58 = local_5c;
  local_53 = local_54;
  local_48 = traverse_func;
  local_40 = closure;
  plutovg_path_traverse_flatten(path,dash_traverse_func,&local_70);
  return;
}

Assistant:

void plutovg_path_traverse_dashed(const plutovg_path_t* path, float offset, const float* dashes, int ndashes, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    float dash_sum = 0.f;
    for(int i = 0; i < ndashes; ++i)
        dash_sum += dashes[i];
    if(ndashes % 2 == 1)
        dash_sum *= 2.f;
    if(dash_sum <= 0.f) {
        plutovg_path_traverse(path, traverse_func, closure);
        return;
    }

    dasher_t dasher;
    dasher.dashes = dashes;
    dasher.ndashes = ndashes;
    dasher.start_phase = fmodf(offset, dash_sum);
    if(dasher.start_phase < 0.f)
        dasher.start_phase += dash_sum;
    dasher.start_index = 0;
    dasher.start_toggle = true;
    while(dasher.start_phase > 0.f && dasher.start_phase >= dasher.dashes[dasher.start_index % dasher.ndashes]) {
        dasher.start_phase -= dashes[dasher.start_index % dasher.ndashes];
        dasher.start_toggle = !dasher.start_toggle;
        dasher.start_index++;
    }

    dasher.phase = dasher.start_phase;
    dasher.index = dasher.start_index;
    dasher.toggle = dasher.start_toggle;
    dasher.current_point = PLUTOVG_EMPTY_POINT;
    dasher.traverse_func = traverse_func;
    dasher.closure = closure;
    plutovg_path_traverse_flatten(path, dash_traverse_func, &dasher);
}